

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# function_pool_task.cpp
# Opt level: O3

void __thiscall Function_Pool::FunctionPoolTask::~FunctionPoolTask(FunctionPoolTask *this)

{
  OutputImageInfo *__ptr;
  InputImageInfo *pIVar1;
  
  (this->super_TaskProviderSingleton).super_AbstractTaskProvider._vptr_AbstractTaskProvider =
       (_func_int **)&PTR__FunctionPoolTask_00132d40;
  __ptr = (this->_infoOut)._M_t.
          super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
          ._M_t.
          super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
          .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl;
  if (__ptr != (OutputImageInfo *)0x0) {
    std::default_delete<Function_Pool::OutputImageInfo>::operator()
              ((default_delete<Function_Pool::OutputImageInfo> *)&this->_infoOut,__ptr);
  }
  (this->_infoOut)._M_t.
  super___uniq_ptr_impl<Function_Pool::OutputImageInfo,_std::default_delete<Function_Pool::OutputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::OutputImageInfo_*,_std::default_delete<Function_Pool::OutputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::OutputImageInfo_*,_false>._M_head_impl =
       (OutputImageInfo *)0x0;
  pIVar1 = (this->_infoIn2)._M_t.
           super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  if (pIVar1 != (InputImageInfo *)0x0) {
    std::default_delete<Function_Pool::InputImageInfo>::operator()
              ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn2,pIVar1);
  }
  (this->_infoIn2)._M_t.
  super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
       (InputImageInfo *)0x0;
  pIVar1 = (this->_infoIn1)._M_t.
           super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
           ._M_t.
           super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
           .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl;
  if (pIVar1 != (InputImageInfo *)0x0) {
    std::default_delete<Function_Pool::InputImageInfo>::operator()
              ((default_delete<Function_Pool::InputImageInfo> *)&this->_infoIn1,pIVar1);
  }
  (this->_infoIn1)._M_t.
  super___uniq_ptr_impl<Function_Pool::InputImageInfo,_std::default_delete<Function_Pool::InputImageInfo>_>
  ._M_t.
  super__Tuple_impl<0UL,_Function_Pool::InputImageInfo_*,_std::default_delete<Function_Pool::InputImageInfo>_>
  .super__Head_base<0UL,_Function_Pool::InputImageInfo_*,_false>._M_head_impl =
       (InputImageInfo *)0x0;
  TaskProviderSingleton::~TaskProviderSingleton(&this->super_TaskProviderSingleton);
  return;
}

Assistant:

FunctionPoolTask::~FunctionPoolTask()
    {
    }